

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm1d.c
# Opt level: O2

void av1_idct16(int32_t *input,int32_t *output,int8_t cos_bit,int8_t *stage_range)

{
  int8_t iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int32_t iVar10;
  int32_t iVar11;
  int32_t iVar12;
  int32_t iVar13;
  int32_t iVar14;
  int32_t iVar15;
  int32_t iVar16;
  int32_t iVar17;
  int32_t iVar18;
  int32_t iVar19;
  int32_t iVar20;
  int32_t iVar21;
  int32_t iVar22;
  int32_t iVar23;
  int32_t iVar24;
  int32_t iVar25;
  int32_t iVar26;
  long lVar27;
  undefined7 in_register_00000011;
  int iVar28;
  long lVar29;
  long lVar30;
  int iVar31;
  long lVar32;
  int32_t step [16];
  
  lVar32 = (long)(int)CONCAT71(in_register_00000011,cos_bit) * 0x100;
  *output = *input;
  output[1] = input[8];
  output[2] = input[4];
  output[3] = input[0xc];
  output[4] = input[2];
  output[5] = input[10];
  output[6] = input[6];
  output[7] = input[0xe];
  output[8] = input[1];
  output[9] = input[9];
  output[10] = input[5];
  output[0xb] = input[0xd];
  output[0xc] = input[3];
  output[0xd] = input[0xb];
  output[0xe] = input[7];
  output[0xf] = input[0xf];
  av1_range_check_buf(1,input,output,0x10,stage_range[1]);
  step._0_8_ = *(undefined8 *)output;
  step._8_8_ = *(undefined8 *)(output + 2);
  step._16_8_ = *(undefined8 *)(output + 4);
  step._24_8_ = *(undefined8 *)(output + 6);
  iVar2 = *(int *)((long)vert_filter_length_chroma + lVar32 + 0x250);
  iVar3 = *(int *)((long)vert_filter_length_chroma + lVar32 + 0x170);
  lVar29 = 1L << (cos_bit - 1U & 0x3f);
  step[8] = (int32_t)(output[8] * iVar2 + lVar29 + (long)-(iVar3 * output[0xf]) >> (cos_bit & 0x3fU)
                     );
  iVar4 = *(int *)((long)vert_filter_length_chroma + lVar32 + 0x1d0);
  iVar5 = *(int *)((long)vert_filter_length_chroma + lVar32 + 0x1f0);
  step[9] = (int32_t)(output[9] * iVar4 + lVar29 + (long)-(iVar5 * output[0xe]) >> (cos_bit & 0x3fU)
                     );
  iVar6 = *(int *)((long)vert_filter_length_chroma + lVar32 + 0x210);
  iVar31 = *(int *)((long)vert_filter_length_chroma + lVar32 + 0x1b0);
  step[10] = (int32_t)(output[10] * iVar6 + lVar29 + (long)-(iVar31 * output[0xd]) >>
                      (cos_bit & 0x3fU));
  iVar7 = *(int *)((long)vert_filter_length_chroma + lVar32 + 0x230);
  iVar8 = *(int *)((long)vert_filter_length_chroma + lVar32 + 400);
  step[0xb] = (int32_t)(output[0xb] * iVar8 + lVar29 + (long)-(iVar7 * output[0xc]) >>
                       (cos_bit & 0x3fU));
  step[0xc] = (int32_t)(iVar7 * output[0xb] + lVar29 + (long)(output[0xc] * iVar8) >>
                       (cos_bit & 0x3fU));
  step[0xd] = (int32_t)(iVar31 * output[10] + lVar29 + (long)(output[0xd] * iVar6) >>
                       (cos_bit & 0x3fU));
  step[0xe] = (int32_t)(iVar5 * output[9] + lVar29 + (long)(output[0xe] * iVar4) >>
                       (cos_bit & 0x3fU));
  iVar4 = *(int *)((long)vert_filter_length_chroma + lVar32 + 0x180);
  step[0xf] = (int32_t)(iVar3 * output[8] + lVar29 + (long)(output[0xf] * iVar2) >>
                       (cos_bit & 0x3fU));
  av1_range_check_buf(2,input,step,0x10,stage_range[2]);
  iVar20 = step[9];
  iVar18 = step[8];
  *(undefined8 *)output = step._0_8_;
  *(undefined8 *)(output + 2) = step._8_8_;
  iVar2 = *(int *)((long)vert_filter_length_chroma + lVar32 + 0x240);
  output[4] = (int32_t)(step[4] * iVar2 + lVar29 + (long)-(iVar4 * step[7]) >> (cos_bit & 0x3fU));
  iVar3 = *(int *)((long)vert_filter_length_chroma + lVar32 + 0x1c0);
  iVar5 = *(int *)((long)vert_filter_length_chroma + lVar32 + 0x200);
  output[5] = (int32_t)(step[5] * iVar3 + lVar29 + (long)-(iVar5 * step[6]) >> (cos_bit & 0x3fU));
  output[6] = (int32_t)(iVar5 * step[5] + lVar29 + (long)(step[6] * iVar3) >> (cos_bit & 0x3fU));
  output[7] = (int32_t)(iVar4 * step[4] + lVar29 + (long)(step[7] * iVar2) >> (cos_bit & 0x3fU));
  iVar17 = clamp_value(step[9] + step[8],stage_range[3]);
  output[8] = iVar17;
  iVar17 = clamp_value(iVar18 - iVar20,stage_range[3]);
  iVar20 = step[0xb];
  iVar18 = step[10];
  output[9] = iVar17;
  iVar17 = clamp_value(step[0xb] - step[10],stage_range[3]);
  output[10] = iVar17;
  iVar17 = clamp_value(iVar20 + iVar18,stage_range[3]);
  iVar20 = step[0xd];
  iVar18 = step[0xc];
  output[0xb] = iVar17;
  iVar17 = clamp_value(step[0xd] + step[0xc],stage_range[3]);
  output[0xc] = iVar17;
  iVar17 = clamp_value(iVar18 - iVar20,stage_range[3]);
  iVar20 = step[0xf];
  iVar18 = step[0xe];
  output[0xd] = iVar17;
  iVar17 = clamp_value(step[0xf] - step[0xe],stage_range[3]);
  output[0xe] = iVar17;
  iVar18 = clamp_value(iVar20 + iVar18,stage_range[3]);
  output[0xf] = iVar18;
  av1_range_check_buf(3,input,output,0x10,stage_range[3]);
  iVar2 = *(int *)((long)vert_filter_length_chroma + lVar32 + 0x1e0);
  lVar30 = (long)iVar2;
  lVar27 = *output * lVar30 + lVar29;
  step[0] = (int32_t)(output[1] * iVar2 + lVar27 >> (cos_bit & 0x3fU));
  iVar28 = -iVar2;
  step[1] = (int32_t)(output[1] * iVar28 + lVar27 >> (cos_bit & 0x3fU));
  iVar3 = *(int *)((long)vert_filter_length_chroma + lVar32 + 0x220);
  iVar4 = *(int *)((long)vert_filter_length_chroma + lVar32 + 0x1a0);
  iVar31 = -iVar4;
  step[2] = (int32_t)(output[2] * iVar3 + lVar29 + (long)(output[3] * iVar31) >> (cos_bit & 0x3fU));
  step[3] = (int32_t)(iVar4 * output[2] + lVar29 + (long)(output[3] * iVar3) >> (cos_bit & 0x3fU));
  iVar5 = output[4];
  iVar6 = output[5];
  iVar1 = stage_range[4];
  iVar18 = clamp_value(iVar5 + iVar6,iVar1);
  step[4] = iVar18;
  iVar18 = clamp_value(iVar5 - iVar6,iVar1);
  iVar5 = output[6];
  iVar6 = output[7];
  step[5] = iVar18;
  iVar18 = clamp_value(iVar6 - iVar5,iVar1);
  step[6] = iVar18;
  iVar18 = clamp_value(iVar6 + iVar5,iVar1);
  step[8] = output[8];
  step[9] = (int32_t)(output[0xe] * iVar3 + lVar29 + (long)(output[9] * iVar31) >> (cos_bit & 0x3fU)
                     );
  step[10] = (int32_t)(-(iVar3 * output[10]) + lVar29 + (long)(output[0xd] * iVar31) >>
                      (cos_bit & 0x3fU));
  step._44_8_ = *(undefined8 *)(output + 0xb);
  step[0xd] = (int32_t)(output[0xd] * iVar3 + lVar29 + (long)(iVar31 * output[10]) >>
                       (cos_bit & 0x3fU));
  step[0xe] = (int32_t)(output[9] * iVar3 + lVar29 + (long)(output[0xe] * iVar4) >>
                       (cos_bit & 0x3fU));
  step[0xf] = output[0xf];
  step[7] = iVar18;
  av1_range_check_buf(4,input,step,0x10,iVar1);
  iVar21 = step[3];
  iVar18 = step[0];
  iVar19 = clamp_value(step[3] + step[0],stage_range[5]);
  iVar17 = step[2];
  iVar20 = step[1];
  *output = iVar19;
  iVar19 = clamp_value(step[1] + step[2],stage_range[5]);
  output[1] = iVar19;
  iVar20 = clamp_value(iVar20 - iVar17,stage_range[5]);
  output[2] = iVar20;
  iVar20 = clamp_value(iVar18 - iVar21,stage_range[5]);
  iVar18 = step[8];
  output[3] = iVar20;
  output[4] = step[4];
  lVar27 = step[6] * lVar30 + lVar29;
  output[5] = (int32_t)(step[5] * iVar28 + lVar27 >> (cos_bit & 0x3fU));
  output[6] = (int32_t)(step[5] * iVar2 + lVar27 >> (cos_bit & 0x3fU));
  output[7] = step[7];
  iVar21 = step[0xb];
  iVar19 = clamp_value(step[0xb] + step[8],stage_range[5]);
  iVar17 = step[10];
  iVar20 = step[9];
  output[8] = iVar19;
  iVar19 = clamp_value(step[9] + step[10],stage_range[5]);
  output[9] = iVar19;
  iVar20 = clamp_value(iVar20 - iVar17,stage_range[5]);
  output[10] = iVar20;
  iVar18 = clamp_value(iVar18 - iVar21,stage_range[5]);
  iVar21 = step[0xf];
  output[0xb] = iVar18;
  iVar18 = step[0xc];
  iVar19 = clamp_value(step[0xf] - step[0xc],stage_range[5]);
  iVar17 = step[0xe];
  iVar20 = step[0xd];
  output[0xc] = iVar19;
  iVar19 = clamp_value(step[0xe] - step[0xd],stage_range[5]);
  output[0xd] = iVar19;
  iVar20 = clamp_value(iVar17 + iVar20,stage_range[5]);
  output[0xe] = iVar20;
  iVar18 = clamp_value(iVar21 + iVar18,stage_range[5]);
  output[0xf] = iVar18;
  av1_range_check_buf(5,input,output,0x10,stage_range[5]);
  iVar3 = *output;
  iVar4 = output[7];
  iVar1 = stage_range[6];
  step[0] = clamp_value(iVar4 + iVar3,iVar1);
  iVar5 = output[1];
  iVar6 = output[6];
  iVar18 = clamp_value(iVar6 + iVar5,iVar1);
  iVar31 = output[2];
  iVar7 = output[5];
  step[1] = iVar18;
  step[2] = clamp_value(iVar7 + iVar31,iVar1);
  iVar8 = output[3];
  iVar9 = output[4];
  iVar18 = clamp_value(iVar9 + iVar8,iVar1);
  step[3] = iVar18;
  step[4] = clamp_value(iVar8 - iVar9,iVar1);
  iVar18 = clamp_value(iVar31 - iVar7,iVar1);
  step[5] = iVar18;
  step[6] = clamp_value(iVar5 - iVar6,iVar1);
  iVar18 = clamp_value(iVar3 - iVar4,iVar1);
  step._32_8_ = *(undefined8 *)(output + 8);
  lVar27 = output[0xd] * lVar30 + lVar29;
  step[10] = (int32_t)(output[10] * iVar28 + lVar27 >> (cos_bit & 0x3fU));
  lVar29 = output[0xc] * lVar30 + lVar29;
  step[0xb] = (int32_t)(iVar28 * output[0xb] + lVar29 >> (cos_bit & 0x3fU));
  step[0xc] = (int32_t)(output[0xb] * iVar2 + lVar29 >> (cos_bit & 0x3fU));
  step[0xd] = (int32_t)(output[10] * iVar2 + lVar27 >> (cos_bit & 0x3fU));
  step._56_8_ = *(undefined8 *)(output + 0xe);
  step[7] = iVar18;
  av1_range_check_buf(6,input,step,0x10,iVar1);
  iVar18 = step[0];
  iVar16 = step[0xf];
  iVar17 = clamp_value(step[0xf] + step[0],stage_range[7]);
  iVar20 = step[1];
  *output = iVar17;
  iVar15 = step[0xe];
  iVar21 = clamp_value(step[0xe] + step[1],stage_range[7]);
  iVar14 = step[0xd];
  iVar17 = step[2];
  output[1] = iVar21;
  iVar19 = clamp_value(step[0xd] + step[2],stage_range[7]);
  iVar13 = step[0xc];
  iVar21 = step[3];
  output[2] = iVar19;
  iVar22 = clamp_value(step[0xc] + step[3],stage_range[7]);
  iVar12 = step[0xb];
  iVar19 = step[4];
  output[3] = iVar22;
  iVar23 = clamp_value(step[0xb] + step[4],stage_range[7]);
  iVar11 = step[10];
  iVar22 = step[5];
  output[4] = iVar23;
  iVar24 = clamp_value(step[10] + step[5],stage_range[7]);
  iVar23 = step[6];
  output[5] = iVar24;
  iVar10 = step[9];
  iVar25 = clamp_value(step[9] + step[6],stage_range[7]);
  iVar24 = step[7];
  output[6] = iVar25;
  iVar25 = step[8];
  iVar26 = clamp_value(step[7] + step[8],stage_range[7]);
  output[7] = iVar26;
  iVar24 = clamp_value(iVar24 - iVar25,stage_range[7]);
  output[8] = iVar24;
  iVar23 = clamp_value(iVar23 - iVar10,stage_range[7]);
  output[9] = iVar23;
  iVar22 = clamp_value(iVar22 - iVar11,stage_range[7]);
  output[10] = iVar22;
  iVar19 = clamp_value(iVar19 - iVar12,stage_range[7]);
  output[0xb] = iVar19;
  iVar21 = clamp_value(iVar21 - iVar13,stage_range[7]);
  output[0xc] = iVar21;
  iVar17 = clamp_value(iVar17 - iVar14,stage_range[7]);
  output[0xd] = iVar17;
  iVar20 = clamp_value(iVar20 - iVar15,stage_range[7]);
  output[0xe] = iVar20;
  iVar18 = clamp_value(iVar18 - iVar16,stage_range[7]);
  output[0xf] = iVar18;
  return;
}

Assistant:

void av1_idct16(const int32_t *input, int32_t *output, int8_t cos_bit,
                const int8_t *stage_range) {
  assert(output != input);
  const int32_t size = 16;
  const int32_t *cospi = cospi_arr(cos_bit);

  int32_t stage = 0;
  int32_t *bf0, *bf1;
  int32_t step[16];

  // stage 0;

  // stage 1;
  stage++;
  bf1 = output;
  bf1[0] = input[0];
  bf1[1] = input[8];
  bf1[2] = input[4];
  bf1[3] = input[12];
  bf1[4] = input[2];
  bf1[5] = input[10];
  bf1[6] = input[6];
  bf1[7] = input[14];
  bf1[8] = input[1];
  bf1[9] = input[9];
  bf1[10] = input[5];
  bf1[11] = input[13];
  bf1[12] = input[3];
  bf1[13] = input[11];
  bf1[14] = input[7];
  bf1[15] = input[15];
  av1_range_check_buf(stage, input, bf1, size, stage_range[stage]);

  // stage 2
  stage++;
  bf0 = output;
  bf1 = step;
  bf1[0] = bf0[0];
  bf1[1] = bf0[1];
  bf1[2] = bf0[2];
  bf1[3] = bf0[3];
  bf1[4] = bf0[4];
  bf1[5] = bf0[5];
  bf1[6] = bf0[6];
  bf1[7] = bf0[7];
  bf1[8] = half_btf(cospi[60], bf0[8], -cospi[4], bf0[15], cos_bit);
  bf1[9] = half_btf(cospi[28], bf0[9], -cospi[36], bf0[14], cos_bit);
  bf1[10] = half_btf(cospi[44], bf0[10], -cospi[20], bf0[13], cos_bit);
  bf1[11] = half_btf(cospi[12], bf0[11], -cospi[52], bf0[12], cos_bit);
  bf1[12] = half_btf(cospi[52], bf0[11], cospi[12], bf0[12], cos_bit);
  bf1[13] = half_btf(cospi[20], bf0[10], cospi[44], bf0[13], cos_bit);
  bf1[14] = half_btf(cospi[36], bf0[9], cospi[28], bf0[14], cos_bit);
  bf1[15] = half_btf(cospi[4], bf0[8], cospi[60], bf0[15], cos_bit);
  av1_range_check_buf(stage, input, bf1, size, stage_range[stage]);

  // stage 3
  stage++;
  bf0 = step;
  bf1 = output;
  bf1[0] = bf0[0];
  bf1[1] = bf0[1];
  bf1[2] = bf0[2];
  bf1[3] = bf0[3];
  bf1[4] = half_btf(cospi[56], bf0[4], -cospi[8], bf0[7], cos_bit);
  bf1[5] = half_btf(cospi[24], bf0[5], -cospi[40], bf0[6], cos_bit);
  bf1[6] = half_btf(cospi[40], bf0[5], cospi[24], bf0[6], cos_bit);
  bf1[7] = half_btf(cospi[8], bf0[4], cospi[56], bf0[7], cos_bit);
  bf1[8] = clamp_value(bf0[8] + bf0[9], stage_range[stage]);
  bf1[9] = clamp_value(bf0[8] - bf0[9], stage_range[stage]);
  bf1[10] = clamp_value(-bf0[10] + bf0[11], stage_range[stage]);
  bf1[11] = clamp_value(bf0[10] + bf0[11], stage_range[stage]);
  bf1[12] = clamp_value(bf0[12] + bf0[13], stage_range[stage]);
  bf1[13] = clamp_value(bf0[12] - bf0[13], stage_range[stage]);
  bf1[14] = clamp_value(-bf0[14] + bf0[15], stage_range[stage]);
  bf1[15] = clamp_value(bf0[14] + bf0[15], stage_range[stage]);
  av1_range_check_buf(stage, input, bf1, size, stage_range[stage]);

  // stage 4
  stage++;
  bf0 = output;
  bf1 = step;
  bf1[0] = half_btf(cospi[32], bf0[0], cospi[32], bf0[1], cos_bit);
  bf1[1] = half_btf(cospi[32], bf0[0], -cospi[32], bf0[1], cos_bit);
  bf1[2] = half_btf(cospi[48], bf0[2], -cospi[16], bf0[3], cos_bit);
  bf1[3] = half_btf(cospi[16], bf0[2], cospi[48], bf0[3], cos_bit);
  bf1[4] = clamp_value(bf0[4] + bf0[5], stage_range[stage]);
  bf1[5] = clamp_value(bf0[4] - bf0[5], stage_range[stage]);
  bf1[6] = clamp_value(-bf0[6] + bf0[7], stage_range[stage]);
  bf1[7] = clamp_value(bf0[6] + bf0[7], stage_range[stage]);
  bf1[8] = bf0[8];
  bf1[9] = half_btf(-cospi[16], bf0[9], cospi[48], bf0[14], cos_bit);
  bf1[10] = half_btf(-cospi[48], bf0[10], -cospi[16], bf0[13], cos_bit);
  bf1[11] = bf0[11];
  bf1[12] = bf0[12];
  bf1[13] = half_btf(-cospi[16], bf0[10], cospi[48], bf0[13], cos_bit);
  bf1[14] = half_btf(cospi[48], bf0[9], cospi[16], bf0[14], cos_bit);
  bf1[15] = bf0[15];
  av1_range_check_buf(stage, input, bf1, size, stage_range[stage]);

  // stage 5
  stage++;
  bf0 = step;
  bf1 = output;
  bf1[0] = clamp_value(bf0[0] + bf0[3], stage_range[stage]);
  bf1[1] = clamp_value(bf0[1] + bf0[2], stage_range[stage]);
  bf1[2] = clamp_value(bf0[1] - bf0[2], stage_range[stage]);
  bf1[3] = clamp_value(bf0[0] - bf0[3], stage_range[stage]);
  bf1[4] = bf0[4];
  bf1[5] = half_btf(-cospi[32], bf0[5], cospi[32], bf0[6], cos_bit);
  bf1[6] = half_btf(cospi[32], bf0[5], cospi[32], bf0[6], cos_bit);
  bf1[7] = bf0[7];
  bf1[8] = clamp_value(bf0[8] + bf0[11], stage_range[stage]);
  bf1[9] = clamp_value(bf0[9] + bf0[10], stage_range[stage]);
  bf1[10] = clamp_value(bf0[9] - bf0[10], stage_range[stage]);
  bf1[11] = clamp_value(bf0[8] - bf0[11], stage_range[stage]);
  bf1[12] = clamp_value(-bf0[12] + bf0[15], stage_range[stage]);
  bf1[13] = clamp_value(-bf0[13] + bf0[14], stage_range[stage]);
  bf1[14] = clamp_value(bf0[13] + bf0[14], stage_range[stage]);
  bf1[15] = clamp_value(bf0[12] + bf0[15], stage_range[stage]);
  av1_range_check_buf(stage, input, bf1, size, stage_range[stage]);

  // stage 6
  stage++;
  bf0 = output;
  bf1 = step;
  bf1[0] = clamp_value(bf0[0] + bf0[7], stage_range[stage]);
  bf1[1] = clamp_value(bf0[1] + bf0[6], stage_range[stage]);
  bf1[2] = clamp_value(bf0[2] + bf0[5], stage_range[stage]);
  bf1[3] = clamp_value(bf0[3] + bf0[4], stage_range[stage]);
  bf1[4] = clamp_value(bf0[3] - bf0[4], stage_range[stage]);
  bf1[5] = clamp_value(bf0[2] - bf0[5], stage_range[stage]);
  bf1[6] = clamp_value(bf0[1] - bf0[6], stage_range[stage]);
  bf1[7] = clamp_value(bf0[0] - bf0[7], stage_range[stage]);
  bf1[8] = bf0[8];
  bf1[9] = bf0[9];
  bf1[10] = half_btf(-cospi[32], bf0[10], cospi[32], bf0[13], cos_bit);
  bf1[11] = half_btf(-cospi[32], bf0[11], cospi[32], bf0[12], cos_bit);
  bf1[12] = half_btf(cospi[32], bf0[11], cospi[32], bf0[12], cos_bit);
  bf1[13] = half_btf(cospi[32], bf0[10], cospi[32], bf0[13], cos_bit);
  bf1[14] = bf0[14];
  bf1[15] = bf0[15];
  av1_range_check_buf(stage, input, bf1, size, stage_range[stage]);

  // stage 7
  stage++;
  bf0 = step;
  bf1 = output;
  bf1[0] = clamp_value(bf0[0] + bf0[15], stage_range[stage]);
  bf1[1] = clamp_value(bf0[1] + bf0[14], stage_range[stage]);
  bf1[2] = clamp_value(bf0[2] + bf0[13], stage_range[stage]);
  bf1[3] = clamp_value(bf0[3] + bf0[12], stage_range[stage]);
  bf1[4] = clamp_value(bf0[4] + bf0[11], stage_range[stage]);
  bf1[5] = clamp_value(bf0[5] + bf0[10], stage_range[stage]);
  bf1[6] = clamp_value(bf0[6] + bf0[9], stage_range[stage]);
  bf1[7] = clamp_value(bf0[7] + bf0[8], stage_range[stage]);
  bf1[8] = clamp_value(bf0[7] - bf0[8], stage_range[stage]);
  bf1[9] = clamp_value(bf0[6] - bf0[9], stage_range[stage]);
  bf1[10] = clamp_value(bf0[5] - bf0[10], stage_range[stage]);
  bf1[11] = clamp_value(bf0[4] - bf0[11], stage_range[stage]);
  bf1[12] = clamp_value(bf0[3] - bf0[12], stage_range[stage]);
  bf1[13] = clamp_value(bf0[2] - bf0[13], stage_range[stage]);
  bf1[14] = clamp_value(bf0[1] - bf0[14], stage_range[stage]);
  bf1[15] = clamp_value(bf0[0] - bf0[15], stage_range[stage]);
}